

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

void av1_upscale_normative_rows
               (AV1_COMMON *cm,uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int plane,
               int rows)

{
  byte bVar1;
  undefined2 uVar2;
  aom_bit_depth_t aVar3;
  size_t size;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  void *memblk;
  void *memblk_00;
  long lVar8;
  int iVar9;
  undefined8 *puVar10;
  int *piVar11;
  size_t size_00;
  long lVar12;
  ulong uVar13;
  undefined8 *puVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint8_t *puVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int *piVar26;
  undefined8 *puVar27;
  int *piVar28;
  bool bVar29;
  TileInfo tile_col;
  
  bVar29 = false;
  if (0 < plane) {
    bVar29 = cm->seq_params->subsampling_x != 0;
  }
  uVar22 = (uint)(1 << bVar29) >> 1;
  iVar15 = (int)(cm->width + uVar22) >> bVar29;
  iVar23 = (int)(uVar22 + cm->superres_upscaled_width) >> bVar29;
  bVar1 = cm->superres_scale_denominator;
  iVar6 = (iVar23 / 2 + iVar15 * 0x4000) / iVar23;
  uVar22 = ((iVar15 - iVar23) * 0x2000 + iVar23 / 2) / iVar23 +
           (iVar6 * iVar23 + iVar15 * -0x4000) / -2 + 0x80U & 0x3fff;
  size_00 = (long)rows * 10;
  lVar12 = (long)src_stride;
  uVar17 = 0;
  if (0 < rows) {
    uVar17 = (ulong)(uint)rows;
  }
  size = (long)rows * 5;
  lVar5 = lVar12 * 2;
  lVar4 = uVar17 * 5;
  iVar15 = 0;
  do {
    if ((cm->tiles).cols <= iVar15) {
      return;
    }
    av1_tile_set_col(&tile_col,cm,iVar15);
    iVar16 = tile_col.mi_col_start << (2U - bVar29 & 0x1f);
    iVar21 = tile_col.mi_col_end << (2U - bVar29 & 0x1f);
    iVar9 = (int)(iVar16 * (uint)bVar1) / 8;
    iVar24 = (cm->tiles).cols + -1;
    iVar7 = iVar23;
    if (iVar15 != iVar24) {
      iVar7 = (int)(iVar21 * (uint)bVar1) / 8;
    }
    iVar21 = iVar21 - iVar16;
    puVar19 = src + iVar16;
    iVar7 = iVar7 - iVar9;
    lVar25 = (long)iVar21;
    if (cm->seq_params->use_highbitdepth == '\0') {
      piVar28 = (int *)(puVar19 + -5);
      if (iVar15 == 0) {
        memblk = aom_malloc(size);
        if (memblk == (void *)0x0) goto LAB_0034123c;
        piVar26 = piVar28;
        for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 5) {
          *(char *)((long)memblk + lVar8 + 4) = (char)piVar26[1];
          *(int *)((long)memblk + lVar8) = *piVar26;
          iVar16 = (uint)*(byte *)((long)piVar26 + 5) * 0x1010101;
          *piVar26 = iVar16;
          *(char *)(piVar26 + 1) = (char)iVar16;
          piVar26 = (int *)((long)piVar26 + lVar12);
        }
      }
      else {
        memblk = (void *)0x0;
      }
      piVar26 = (int *)(puVar19 + lVar25);
      if (iVar15 == iVar24) {
        memblk_00 = aom_malloc(size);
        if (memblk_00 != (void *)0x0) {
          piVar11 = piVar26;
          for (lVar25 = 0; lVar4 != lVar25; lVar25 = lVar25 + 5) {
            *(char *)((long)memblk_00 + lVar25 + 4) = (char)piVar11[1];
            *(int *)((long)memblk_00 + lVar25) = *piVar11;
            iVar16 = (uint)*(byte *)((long)piVar11 + -1) * 0x1010101;
            *piVar11 = iVar16;
            *(char *)(piVar11 + 1) = (char)iVar16;
            piVar11 = (int *)((long)piVar11 + lVar12);
          }
          goto LAB_00341186;
        }
LAB_00341234:
        aom_free(memblk);
        goto LAB_0034123c;
      }
      memblk_00 = (void *)0x0;
LAB_00341186:
      (*av1_convolve_horiz_rs)
                (puVar19 + -1,src_stride,dst + iVar9,dst_stride,iVar7,rows,
                 av1_resize_filter_normative[0],uVar22,iVar6);
      if (iVar15 == 0) {
        for (lVar25 = 0; lVar4 != lVar25; lVar25 = lVar25 + 5) {
          *(undefined1 *)(piVar28 + 1) = *(undefined1 *)((long)memblk + lVar25 + 4);
          *piVar28 = *(int *)((long)memblk + lVar25);
          piVar28 = (int *)((long)piVar28 + lVar12);
        }
        aom_free(memblk);
      }
      if (iVar15 == iVar24) {
        for (lVar25 = 0; lVar4 != lVar25; lVar25 = lVar25 + 5) {
          *(undefined1 *)(piVar26 + 1) = *(undefined1 *)((long)memblk_00 + lVar25 + 4);
          *piVar26 = *(int *)((long)memblk_00 + lVar25);
          piVar26 = (int *)((long)piVar26 + lVar12);
        }
        goto LAB_00341225;
      }
    }
    else {
      lVar8 = (long)puVar19 * 2;
      aVar3 = cm->seq_params->bit_depth;
      puVar14 = (undefined8 *)((long)puVar19 * 2 + -10);
      if (iVar15 == 0) {
        memblk = aom_malloc(size_00);
        if (memblk != (void *)0x0) {
          lVar20 = lVar8;
          for (uVar13 = 0; uVar13 != uVar17; uVar13 = uVar13 + 1) {
            lVar18 = uVar13 * lVar12;
            *(undefined2 *)((long)memblk + uVar13 * 10 + 8) =
                 *(undefined2 *)((long)puVar19 * 2 + -2 + lVar18 * 2);
            *(undefined8 *)((long)memblk + uVar13 * 10) =
                 *(undefined8 *)((long)puVar14 + lVar18 * 2);
            uVar2 = *(undefined2 *)(lVar8 + lVar18 * 2);
            for (lVar18 = -10; lVar18 != 0; lVar18 = lVar18 + 2) {
              *(undefined2 *)(lVar20 + lVar18) = uVar2;
            }
            lVar20 = lVar20 + lVar5;
          }
          goto LAB_00340f11;
        }
LAB_0034123c:
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Error upscaling frame");
      }
      else {
        memblk = (void *)0x0;
LAB_00340f11:
        puVar27 = (undefined8 *)(lVar25 * 2 + (long)puVar19 * 2);
        if (iVar15 == iVar24) {
          memblk_00 = aom_malloc(size_00);
          if (memblk_00 == (void *)0x0) goto LAB_00341234;
          puVar10 = puVar27;
          for (uVar13 = 0; uVar13 != uVar17; uVar13 = uVar13 + 1) {
            lVar20 = uVar13 * lVar12;
            *(undefined2 *)((long)memblk_00 + uVar13 * 10 + 8) =
                 *(undefined2 *)((long)puVar27 + lVar20 * 2 + 8);
            *(undefined8 *)((long)memblk_00 + uVar13 * 10) =
                 *(undefined8 *)((long)puVar27 + lVar20 * 2);
            uVar2 = *(undefined2 *)(lVar8 + lVar25 * 2 + -2 + lVar20 * 2);
            for (lVar20 = 0; lVar20 != 5; lVar20 = lVar20 + 1) {
              *(undefined2 *)((long)puVar10 + lVar20 * 2) = uVar2;
            }
            puVar10 = (undefined8 *)((long)puVar10 + lVar5);
          }
        }
        else {
          memblk_00 = (void *)0x0;
        }
        (*av1_highbd_convolve_horiz_rs)
                  ((uint16_t *)((long)puVar19 * 2 + -2),src_stride,
                   (uint16_t *)((long)(dst + iVar9) * 2),dst_stride,iVar7,rows,
                   av1_resize_filter_normative[0],uVar22,iVar6,aVar3);
        if (iVar15 == 0) {
          for (lVar25 = 0; uVar17 * 10 != lVar25; lVar25 = lVar25 + 10) {
            *(undefined2 *)(puVar14 + 1) = *(undefined2 *)((long)memblk + lVar25 + 8);
            *puVar14 = *(undefined8 *)((long)memblk + lVar25);
            puVar14 = (undefined8 *)((long)puVar14 + lVar5);
          }
          aom_free(memblk);
        }
        if (iVar15 == iVar24) {
          for (lVar25 = 0; uVar17 * 10 != lVar25; lVar25 = lVar25 + 10) {
            *(undefined2 *)(puVar27 + 1) = *(undefined2 *)((long)memblk_00 + lVar25 + 8);
            *puVar27 = *(undefined8 *)((long)memblk_00 + lVar25);
            puVar27 = (undefined8 *)((long)puVar27 + lVar5);
          }
LAB_00341225:
          aom_free(memblk_00);
        }
      }
    }
    uVar22 = uVar22 + iVar21 * -0x4000 + iVar7 * iVar6;
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

void av1_upscale_normative_rows(const AV1_COMMON *cm, const uint8_t *src,
                                int src_stride, uint8_t *dst, int dst_stride,
                                int plane, int rows) {
  const int is_uv = (plane > 0);
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int downscaled_plane_width = ROUND_POWER_OF_TWO(cm->width, ss_x);
  const int upscaled_plane_width =
      ROUND_POWER_OF_TWO(cm->superres_upscaled_width, ss_x);
  const int superres_denom = cm->superres_scale_denominator;

  TileInfo tile_col;
  const int32_t x_step_qn = av1_get_upscale_convolve_step(
      downscaled_plane_width, upscaled_plane_width);
  int32_t x0_qn = get_upscale_convolve_x0(downscaled_plane_width,
                                          upscaled_plane_width, x_step_qn);

  for (int j = 0; j < cm->tiles.cols; j++) {
    av1_tile_set_col(&tile_col, cm, j);
    // Determine the limits of this tile column in both the source
    // and destination images.
    // Note: The actual location which we start sampling from is
    // (downscaled_x0 - 1 + (x0_qn/2^14)), and this quantity increases
    // by exactly dst_width * (x_step_qn/2^14) pixels each iteration.
    const int downscaled_x0 = tile_col.mi_col_start << (MI_SIZE_LOG2 - ss_x);
    const int downscaled_x1 = tile_col.mi_col_end << (MI_SIZE_LOG2 - ss_x);
    const int src_width = downscaled_x1 - downscaled_x0;

    const int upscaled_x0 = (downscaled_x0 * superres_denom) / SCALE_NUMERATOR;
    int upscaled_x1;
    if (j == cm->tiles.cols - 1) {
      // Note that we can't just use AOMMIN here - due to rounding,
      // (downscaled_x1 * superres_denom) / SCALE_NUMERATOR may be less than
      // upscaled_plane_width.
      upscaled_x1 = upscaled_plane_width;
    } else {
      upscaled_x1 = (downscaled_x1 * superres_denom) / SCALE_NUMERATOR;
    }

    const uint8_t *const src_ptr = src + downscaled_x0;
    uint8_t *const dst_ptr = dst + upscaled_x0;
    const int dst_width = upscaled_x1 - upscaled_x0;

    const int pad_left = (j == 0);
    const int pad_right = (j == cm->tiles.cols - 1);

    bool success;
#if CONFIG_AV1_HIGHBITDEPTH
    if (cm->seq_params->use_highbitdepth)
      success = highbd_upscale_normative_rect(
          src_ptr, rows, src_width, src_stride, dst_ptr, rows, dst_width,
          dst_stride, x_step_qn, x0_qn, pad_left, pad_right,
          cm->seq_params->bit_depth);
    else
      success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                       dst_ptr, rows, dst_width, dst_stride,
                                       x_step_qn, x0_qn, pad_left, pad_right);
#else
    success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                     dst_ptr, rows, dst_width, dst_stride,
                                     x_step_qn, x0_qn, pad_left, pad_right);
#endif
    if (!success) {
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Error upscaling frame");
    }
    // Update the fractional pixel offset to prepare for the next tile column.
    x0_qn += (dst_width * x_step_qn) - (src_width << RS_SCALE_SUBPEL_BITS);
  }
}